

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_control_mobile_impl.cc
# Opt level: O0

void __thiscall webrtc::EchoControlMobileImpl::ReadQueuedRenderData(EchoControlMobileImpl *this)

{
  size_t sVar1;
  bool bVar2;
  ostream *poVar3;
  pointer this_00;
  size_type sVar4;
  pointer pSVar5;
  ulong nrOfSamples;
  reference this_01;
  pointer this_02;
  void *aecmInst;
  reference farend;
  unique_ptr<webrtc::EchoControlMobileImpl::Canceller,_std::default_delete<webrtc::EchoControlMobileImpl::Canceller>_>
  *canceller;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<webrtc::EchoControlMobileImpl::Canceller,_std::default_delete<webrtc::EchoControlMobileImpl::Canceller>_>,_std::allocator<std::unique_ptr<webrtc::EchoControlMobileImpl::Canceller,_std::default_delete<webrtc::EchoControlMobileImpl::Canceller>_>_>_>
  *__range2;
  size_t num_frames_per_band;
  size_t buffer_index;
  FatalMessage local_1a8;
  FatalMessageVoidify local_19;
  CritScope local_18;
  CritScope cs_capture;
  EchoControlMobileImpl *this_local;
  
  cs_capture.cs_ = (CriticalSection *)this;
  rtc::CritScope::CritScope(&local_18,this->crit_capture_);
  bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->stream_properties_);
  if (bVar2) {
    if ((this->enabled_ & 1U) != 0) {
      while( true ) {
        this_00 = std::
                  unique_ptr<webrtc::SwapQueue<std::vector<short,_std::allocator<short>_>,_webrtc::RenderQueueItemVerifier<short>_>,_std::default_delete<webrtc::SwapQueue<std::vector<short,_std::allocator<short>_>,_webrtc::RenderQueueItemVerifier<short>_>_>_>
                  ::operator->(&this->render_signal_queue_);
        bVar2 = SwapQueue<std::vector<short,_std::allocator<short>_>,_webrtc::RenderQueueItemVerifier<short>_>
                ::Remove(this_00,&this->capture_queue_buffer_);
        if (!bVar2) break;
        num_frames_per_band = 0;
        sVar4 = std::vector<short,_std::allocator<short>_>::size(&this->capture_queue_buffer_);
        pSVar5 = std::
                 unique_ptr<webrtc::EchoControlMobileImpl::StreamProperties,_std::default_delete<webrtc::EchoControlMobileImpl::StreamProperties>_>
                 ::operator->(&this->stream_properties_);
        sVar1 = pSVar5->num_output_channels;
        pSVar5 = std::
                 unique_ptr<webrtc::EchoControlMobileImpl::StreamProperties,_std::default_delete<webrtc::EchoControlMobileImpl::StreamProperties>_>
                 ::operator->(&this->stream_properties_);
        nrOfSamples = sVar4 / (sVar1 * pSVar5->num_reverse_channels);
        __end2 = std::
                 vector<std::unique_ptr<webrtc::EchoControlMobileImpl::Canceller,_std::default_delete<webrtc::EchoControlMobileImpl::Canceller>_>,_std::allocator<std::unique_ptr<webrtc::EchoControlMobileImpl::Canceller,_std::default_delete<webrtc::EchoControlMobileImpl::Canceller>_>_>_>
                 ::begin(&this->cancellers_);
        canceller = (unique_ptr<webrtc::EchoControlMobileImpl::Canceller,_std::default_delete<webrtc::EchoControlMobileImpl::Canceller>_>
                     *)std::
                       vector<std::unique_ptr<webrtc::EchoControlMobileImpl::Canceller,_std::default_delete<webrtc::EchoControlMobileImpl::Canceller>_>,_std::allocator<std::unique_ptr<webrtc::EchoControlMobileImpl::Canceller,_std::default_delete<webrtc::EchoControlMobileImpl::Canceller>_>_>_>
                       ::end(&this->cancellers_);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<std::unique_ptr<webrtc::EchoControlMobileImpl::Canceller,_std::default_delete<webrtc::EchoControlMobileImpl::Canceller>_>_*,_std::vector<std::unique_ptr<webrtc::EchoControlMobileImpl::Canceller,_std::default_delete<webrtc::EchoControlMobileImpl::Canceller>_>,_std::allocator<std::unique_ptr<webrtc::EchoControlMobileImpl::Canceller,_std::default_delete<webrtc::EchoControlMobileImpl::Canceller>_>_>_>_>
                                           *)&canceller), bVar2) {
          this_01 = __gnu_cxx::
                    __normal_iterator<std::unique_ptr<webrtc::EchoControlMobileImpl::Canceller,_std::default_delete<webrtc::EchoControlMobileImpl::Canceller>_>_*,_std::vector<std::unique_ptr<webrtc::EchoControlMobileImpl::Canceller,_std::default_delete<webrtc::EchoControlMobileImpl::Canceller>_>,_std::allocator<std::unique_ptr<webrtc::EchoControlMobileImpl::Canceller,_std::default_delete<webrtc::EchoControlMobileImpl::Canceller>_>_>_>_>
                    ::operator*(&__end2);
          this_02 = std::
                    unique_ptr<webrtc::EchoControlMobileImpl::Canceller,_std::default_delete<webrtc::EchoControlMobileImpl::Canceller>_>
                    ::operator->(this_01);
          aecmInst = Canceller::state(this_02);
          farend = std::vector<short,_std::allocator<short>_>::operator[]
                             (&this->capture_queue_buffer_,num_frames_per_band);
          WebRtcAecm_BufferFarend(aecmInst,farend,nrOfSamples);
          num_frames_per_band = nrOfSamples + num_frames_per_band;
          __gnu_cxx::
          __normal_iterator<std::unique_ptr<webrtc::EchoControlMobileImpl::Canceller,_std::default_delete<webrtc::EchoControlMobileImpl::Canceller>_>_*,_std::vector<std::unique_ptr<webrtc::EchoControlMobileImpl::Canceller,_std::default_delete<webrtc::EchoControlMobileImpl::Canceller>_>,_std::allocator<std::unique_ptr<webrtc::EchoControlMobileImpl::Canceller,_std::default_delete<webrtc::EchoControlMobileImpl::Canceller>_>_>_>_>
          ::operator++(&__end2);
        }
      }
    }
    rtc::CritScope::~CritScope(&local_18);
    return;
  }
  rtc::FatalMessageVoidify::FatalMessageVoidify(&local_19);
  rtc::FatalMessage::FatalMessage
            (&local_1a8,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/echo_control_mobile_impl.cc"
             ,0xba);
  poVar3 = rtc::FatalMessage::stream(&local_1a8);
  poVar3 = std::operator<<(poVar3,"Check failed: stream_properties_");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"# ");
  rtc::FatalMessageVoidify::operator&(&local_19,poVar3);
  rtc::FatalMessage::~FatalMessage(&local_1a8);
}

Assistant:

void EchoControlMobileImpl::ReadQueuedRenderData() {
  rtc::CritScope cs_capture(crit_capture_);
  RTC_DCHECK(stream_properties_);

  if (!enabled_) {
    return;
  }

  while (render_signal_queue_->Remove(&capture_queue_buffer_)) {
    size_t buffer_index = 0;
    size_t num_frames_per_band = capture_queue_buffer_.size() /
                                 (stream_properties_->num_output_channels *
                                  stream_properties_->num_reverse_channels);

    for (auto& canceller : cancellers_) {
      WebRtcAecm_BufferFarend(canceller->state(),
                              &capture_queue_buffer_[buffer_index],
                              num_frames_per_band);

      buffer_index += num_frames_per_band;
    }
  }
}